

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  ulong uVar2;
  reference pvVar3;
  long in_RCX;
  reference in_RDX;
  reference in_RSI;
  bool bVar4;
  Mat borderm_1;
  Mat m_5;
  int z;
  int q_1;
  Mat bottom_blob_sliced_1;
  Mat borderm;
  Mat m_1;
  int q;
  Mat bottom_blob_sliced;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  int _outc;
  int _outd;
  int _outh;
  int _outw;
  int _coffset;
  int _doffset;
  int _hoffset;
  int _woffset;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *m_4;
  Mat *m;
  Mat *m_6;
  Mat *m_2;
  Mat *m_7;
  Mat *m_3;
  Allocator *_allocator;
  allocator_type *in_stack_fffffffffffff080;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *this_00;
  int in_stack_fffffffffffff088;
  int in_stack_fffffffffffff08c;
  Mat *in_stack_fffffffffffff090;
  void **ppvVar5;
  int in_stack_fffffffffffff098;
  int in_stack_fffffffffffff09c;
  Mat *in_stack_fffffffffffff0a0;
  Allocator *in_stack_fffffffffffff0f0;
  int *in_stack_fffffffffffff160;
  int *in_stack_fffffffffffff168;
  int *in_stack_fffffffffffff170;
  int *in_stack_fffffffffffff178;
  Mat *in_stack_fffffffffffff180;
  Crop *in_stack_fffffffffffff188;
  reference pvVar6;
  int *in_stack_fffffffffffff1d0;
  int *in_stack_fffffffffffff1d8;
  int *in_stack_fffffffffffff1e0;
  int *in_stack_fffffffffffff1e8;
  undefined7 in_stack_fffffffffffff210;
  undefined1 in_stack_fffffffffffff217;
  int *in_stack_fffffffffffff218;
  undefined7 in_stack_fffffffffffff220;
  undefined1 in_stack_fffffffffffff227;
  int *in_stack_fffffffffffff228;
  Mat *pMVar7;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffff230;
  Crop *in_stack_fffffffffffff238;
  int *in_stack_fffffffffffff250;
  int *in_stack_fffffffffffff258;
  int *in_stack_fffffffffffff260;
  int *in_stack_fffffffffffff268;
  undefined8 local_cf0;
  undefined8 local_ce8;
  undefined8 local_ce0;
  undefined4 local_cd8;
  Allocator *local_cd0;
  undefined4 local_cc8;
  undefined4 local_cc4;
  undefined4 local_cc0;
  undefined4 local_cbc;
  undefined4 local_cb8;
  undefined8 local_cb0;
  void *local_ca8;
  int *local_ca0;
  size_t local_c98;
  int local_c90;
  Allocator *local_c88;
  undefined4 local_c80;
  int local_c7c;
  int local_c78;
  undefined4 local_c74;
  undefined4 local_c70;
  long local_c68;
  undefined8 local_c60;
  undefined8 local_c58;
  undefined8 local_c50;
  undefined4 local_c48;
  Allocator *local_c40;
  undefined4 local_c38;
  undefined4 local_c34;
  undefined4 local_c30;
  undefined4 local_c2c;
  undefined4 local_c28;
  undefined8 local_c20;
  void *local_c18;
  int *local_c10;
  ulong local_c08;
  int local_c00;
  Allocator *local_bf8;
  undefined4 local_bf0;
  int local_bec;
  int local_be8;
  undefined4 local_be4;
  undefined4 local_be0;
  long local_bd8;
  int local_bd0;
  int local_bcc;
  Mat local_bc8;
  void *local_b80;
  int *local_b78;
  ulong local_b70;
  int local_b68;
  Allocator *local_b60;
  int local_b58;
  int local_b54;
  int local_b50;
  uint local_b4c;
  int local_b48;
  ulong local_b40;
  void *local_b38;
  int *local_b30;
  ulong local_b28;
  int local_b20;
  Allocator *local_b18;
  int local_b10;
  int local_b0c;
  int local_b08;
  undefined4 local_b04;
  int local_b00;
  ulong local_af8;
  void *local_af0;
  int *local_ae8;
  ulong local_ae0;
  int local_ad8;
  Allocator *local_ad0;
  int local_ac8;
  int local_ac4;
  int local_ac0;
  undefined4 local_abc;
  uint local_ab8;
  ulong local_ab0;
  int local_aa8;
  int local_aa4;
  Mat local_aa0;
  void *local_a58;
  int *local_a50;
  ulong local_a48;
  int local_a40;
  Allocator *local_a38;
  int local_a30;
  int local_a2c;
  int local_a28;
  uint local_a24;
  int local_a20;
  ulong local_a18;
  void *local_a10;
  int *local_a08;
  undefined8 local_a00;
  undefined4 local_9f8;
  long *local_9f0;
  undefined4 local_9e8;
  int local_9e4;
  int local_9e0;
  int local_9dc;
  int local_9d8;
  ulong local_9d0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_9b0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_998;
  size_t local_978;
  int local_96c;
  int local_968;
  int local_964;
  int local_960;
  int local_95c;
  long local_958;
  reference local_950;
  reference local_948;
  int local_934;
  void **local_930;
  Mat *local_920;
  void **local_910;
  void **local_900;
  void **local_8f0;
  Mat *local_8e0;
  undefined8 *local_8d0;
  undefined8 *local_8c0;
  void **local_8b0;
  void **local_8a0;
  void **local_890;
  int local_880;
  undefined4 local_87c;
  reference local_878;
  reference local_870;
  int local_860;
  undefined4 local_85c;
  reference local_858;
  reference local_850;
  int local_840;
  undefined4 local_83c;
  reference local_838;
  reference local_830;
  int local_820;
  undefined4 local_81c;
  reference local_818;
  reference local_810;
  int local_800;
  undefined4 local_7fc;
  reference local_7f8;
  reference local_7f0;
  int local_7e0;
  undefined4 local_7dc;
  reference local_7d8;
  reference local_7d0;
  int local_7c0;
  undefined4 local_7bc;
  reference local_7b8;
  reference local_7b0;
  reference local_7a8;
  reference local_7a0;
  reference local_798;
  reference local_790;
  reference local_788;
  reference local_780;
  reference local_778;
  reference local_770;
  void **local_768;
  void **local_760;
  undefined1 local_751;
  void **local_740;
  undefined1 local_729;
  void **local_718;
  undefined1 local_705;
  int local_704;
  void **local_700;
  undefined8 *local_6f8;
  undefined1 local_6e5;
  int local_6e4;
  void **local_6e0;
  void **local_6d8;
  undefined1 local_6c5;
  int local_6c4;
  undefined8 *local_6b8;
  undefined1 local_6a5;
  int local_6a4;
  void **local_698;
  int local_684;
  undefined8 *local_680;
  void **local_678;
  int local_66c;
  undefined8 *local_668;
  void **local_660;
  int local_5f8;
  undefined4 local_5f4;
  reference local_5f0;
  int local_5e8;
  undefined4 local_5e4;
  reference local_5e0;
  int local_5d8;
  undefined4 local_5d4;
  reference local_5d0;
  int local_5c8;
  undefined4 local_5c4;
  reference local_5c0;
  int local_5b8;
  undefined4 local_5b4;
  reference local_5b0;
  int local_5a8;
  undefined4 local_5a4;
  reference local_5a0;
  int local_598;
  undefined4 local_594;
  reference local_590;
  int local_578;
  undefined4 local_574;
  void **local_570;
  int local_558;
  undefined4 local_554;
  void **local_550;
  int local_538;
  undefined4 local_534;
  void **local_530;
  undefined8 *local_510;
  undefined8 *local_4f0;
  int local_4d8;
  undefined4 local_4d4;
  Mat *local_4d0;
  int local_4b8;
  undefined4 local_4b4;
  void **local_4b0;
  int local_498;
  undefined4 local_494;
  void **local_490;
  int local_478;
  undefined4 local_474;
  void **local_470;
  int local_458;
  undefined4 local_454;
  Mat *local_450;
  int local_438;
  undefined4 local_434;
  void **local_430;
  void *local_428;
  void *local_408;
  void *local_3f8;
  void *local_3e8;
  void *local_3a8;
  void *local_398;
  void *local_388;
  void *local_378;
  void *local_370;
  void *local_368;
  void *local_360;
  void *local_358;
  void *local_350;
  void *local_348;
  reference local_310;
  reference local_308;
  reference local_300;
  reference local_2f8;
  reference local_2f0;
  reference local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  int local_2c4;
  void **local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  int local_2a0;
  int local_29c;
  void **local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  int local_274;
  int local_270;
  int local_26c;
  void **local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  void **local_238;
  undefined4 local_22c;
  long local_228;
  undefined4 local_21c;
  long local_218;
  Allocator *local_210;
  int local_204;
  ulong local_200;
  void *local_1f8;
  uint local_1ec;
  int local_1e8;
  int local_1e4;
  void **local_1e0;
  undefined4 local_1d4;
  long local_1d0;
  Allocator *local_1c8;
  int local_1bc;
  ulong local_1b8;
  void *local_1b0;
  uint local_1a4;
  int local_1a0;
  int local_19c;
  void **local_198;
  undefined4 local_18c;
  long local_188;
  Allocator *local_180;
  int local_174;
  ulong local_170;
  void *local_168;
  int local_15c;
  int local_158;
  int local_154;
  void **local_150;
  undefined4 local_144;
  long local_140;
  Allocator *local_138;
  int local_12c;
  size_t local_128;
  void *local_120;
  int local_114;
  int local_110;
  int local_10c;
  undefined8 *local_108;
  undefined4 local_fc;
  long local_f8;
  Allocator *local_f0;
  int local_e4;
  ulong local_e0;
  void *local_d8;
  uint local_cc;
  int local_c8;
  int local_c4;
  void **local_c0;
  undefined4 local_b4;
  long local_b0;
  Allocator *local_a8;
  int local_9c;
  ulong local_98;
  void *local_90;
  uint local_84;
  int local_80;
  int local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  long local_68;
  Allocator *local_60;
  int local_54;
  size_t local_50;
  void *local_48;
  int local_40;
  int local_3c;
  void **local_38;
  Allocator *local_30;
  int local_24;
  ulong local_20;
  void *local_18;
  int local_10;
  int local_c;
  void **local_8;
  
  local_95c = in_RSI->w;
  local_960 = in_RSI->h;
  local_964 = in_RSI->d;
  local_968 = in_RSI->c;
  local_96c = in_RSI->dims;
  local_978 = in_RSI->elemsize;
  local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = -1;
  local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = -1;
  local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = -1;
  local_958 = in_RCX;
  local_950 = in_RDX;
  local_948 = in_RSI;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x93a68b);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff090,
               CONCAT44(in_stack_fffffffffffff08c,in_stack_fffffffffffff088),
               in_stack_fffffffffffff080);
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x93a6b4);
    pvVar6 = local_948;
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_9b0,0);
    local_7b8 = pvVar6;
    local_7b0 = pvVar3;
    if (pvVar3 != pvVar6) {
      if (pvVar6->refcount != (int *)0x0) {
        piVar1 = pvVar6->refcount;
        local_7bc = 1;
        LOCK();
        local_7c0 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_5f0 = pvVar3;
      if (pvVar3->refcount != (int *)0x0) {
        piVar1 = pvVar3->refcount;
        local_5f4 = 0xffffffff;
        LOCK();
        local_5f8 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_5f8 == 1) {
          if (pvVar3->allocator == (Allocator *)0x0) {
            local_348 = pvVar3->data;
            if (local_348 != (void *)0x0) {
              free(local_348);
            }
          }
          else {
            (*pvVar3->allocator->_vptr_Allocator[3])(pvVar3->allocator,pvVar3->data);
          }
        }
      }
      pvVar3->data = (void *)0x0;
      pvVar3->elemsize = 0;
      pvVar3->elempack = 0;
      pvVar3->dims = 0;
      pvVar3->w = 0;
      pvVar3->h = 0;
      pvVar3->d = 0;
      pvVar3->c = 0;
      pvVar3->cstep = 0;
      pvVar3->refcount = (int *)0x0;
      pvVar3->data = local_7b8->data;
      pvVar3->refcount = local_7b8->refcount;
      pvVar3->elemsize = local_7b8->elemsize;
      pvVar3->elempack = local_7b8->elempack;
      pvVar3->allocator = local_7b8->allocator;
      pvVar3->dims = local_7b8->dims;
      pvVar3->w = local_7b8->w;
      pvVar3->h = local_7b8->h;
      pvVar3->d = local_7b8->d;
      pvVar3->c = local_7b8->c;
      pvVar3->cstep = local_7b8->cstep;
    }
    this_00 = &local_998;
    _allocator = (Allocator *)
                 ((long)&local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                         .super__Vector_impl_data._M_start + 4);
    local_7a8 = pvVar3;
    eval_crop_expr(in_stack_fffffffffffff238,in_stack_fffffffffffff230,in_stack_fffffffffffff228,
                   (int *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                   in_stack_fffffffffffff218,
                   (int *)CONCAT17(in_stack_fffffffffffff217,in_stack_fffffffffffff210),
                   in_stack_fffffffffffff250,in_stack_fffffffffffff258,in_stack_fffffffffffff260,
                   in_stack_fffffffffffff268);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(this_00);
  }
  else {
    local_768 = &local_a10;
    local_770 = local_948;
    if (local_948->dims == 1) {
      local_2c4 = local_948->w * local_948->elempack;
      local_2c0 = &local_a10;
      local_2d0 = 0;
      local_2d8 = 4;
      local_2e0 = 0;
      local_a00 = 4;
      local_9f8 = 1;
      local_9e8 = 1;
      local_9e0 = 1;
      local_9dc = 1;
      local_9d8 = 1;
      local_9d0 = (ulong)local_2c4;
      local_9e4 = local_2c4;
    }
    else if (local_948->dims == 2) {
      local_29c = local_948->w;
      local_2a0 = local_948->h * local_948->elempack;
      local_298 = &local_a10;
      local_2a8 = 0;
      local_2b0 = 4;
      local_2b8 = 0;
      local_a00 = 4;
      local_9f8 = 1;
      local_9e8 = 2;
      local_9dc = 1;
      local_9d8 = 1;
      local_9d0 = (long)local_29c * (long)local_2a0;
      local_9e4 = local_29c;
      local_9e0 = local_2a0;
    }
    else if (local_948->dims == 3) {
      local_26c = local_948->w;
      local_270 = local_948->h;
      local_274 = local_948->c * local_948->elempack;
      local_268 = &local_a10;
      local_280 = 0;
      local_288 = 4;
      local_290 = 0;
      local_a00 = 4;
      local_9f8 = 1;
      local_9e8 = 3;
      local_9dc = 1;
      local_218 = (long)local_26c * (long)local_270 * 4;
      local_21c = 0x10;
      local_9d0 = (local_218 + 0xfU & 0xfffffffffffffff0) / 4;
      local_9e4 = local_26c;
      local_9e0 = local_270;
      local_9d8 = local_274;
    }
    else if (local_948->dims == 4) {
      local_23c = local_948->w;
      local_240 = local_948->h;
      local_244 = local_948->d;
      local_248 = local_948->c * local_948->elempack;
      local_238 = &local_a10;
      local_250 = 0;
      local_258 = 4;
      local_260 = 0;
      local_a00 = 4;
      local_9f8 = 1;
      local_9e8 = 4;
      local_228 = (long)local_23c * (long)local_240 * (long)local_244 * 4;
      local_22c = 0x10;
      local_9d0 = (local_228 + 0xfU & 0xfffffffffffffff0) / 4;
      local_9e4 = local_23c;
      local_9e0 = local_240;
      local_9dc = local_244;
      local_9d8 = local_248;
    }
    else {
      local_760 = &local_a10;
      local_a00 = 0;
      local_9f8 = 0;
      local_9e8 = 0;
      local_9e4 = 0;
      local_9e0 = 0;
      local_9dc = 0;
      local_9d8 = 0;
      local_9d0 = 0;
    }
    local_9f0 = (long *)0x0;
    local_a08 = (int *)0x0;
    local_a10 = (void *)0x0;
    this_00 = &local_998;
    _allocator = (Allocator *)
                 ((long)&local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                         .super__Vector_impl_data._M_start + 4);
    resolve_crop_roi(in_stack_fffffffffffff188,in_stack_fffffffffffff180,in_stack_fffffffffffff178,
                     in_stack_fffffffffffff170,in_stack_fffffffffffff168,in_stack_fffffffffffff160,
                     in_stack_fffffffffffff1d0,in_stack_fffffffffffff1d8,in_stack_fffffffffffff1e0,
                     in_stack_fffffffffffff1e8);
    local_930 = &local_a10;
    local_430 = local_930;
    if (local_a08 != (int *)0x0) {
      local_434 = 0xffffffff;
      LOCK();
      local_438 = *local_a08;
      *local_a08 = *local_a08 + -1;
      UNLOCK();
      if (local_438 == 1) {
        if (local_9f0 == (long *)0x0) {
          local_428 = local_a10;
          if (local_a10 != (void *)0x0) {
            free(local_a10);
          }
        }
        else {
          (**(code **)(*local_9f0 + 0x18))(local_9f0,local_a10);
        }
      }
    }
    local_a10 = (void *)0x0;
    local_a00 = 0;
    local_9f8 = 0;
    local_9e8 = 0;
    local_9e4 = 0;
    local_9e0 = 0;
    local_9dc = 0;
    local_9d8 = 0;
    local_9d0 = 0;
    local_a08 = (int *)0x0;
  }
  if (local_96c == 1) {
    if (local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ == local_95c) {
      local_7d0 = local_950;
      local_7d8 = local_948;
      if (local_950 != local_948) {
        if (local_948->refcount != (int *)0x0) {
          piVar1 = local_948->refcount;
          local_7dc = 1;
          LOCK();
          local_7e0 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_5e0 = local_950;
        if (local_950->refcount != (int *)0x0) {
          piVar1 = local_950->refcount;
          local_5e4 = 0xffffffff;
          LOCK();
          local_5e8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_5e8 == 1) {
            if (local_950->allocator == (Allocator *)0x0) {
              local_350 = local_950->data;
              if (local_350 != (void *)0x0) {
                free(local_350);
              }
            }
            else {
              (*local_950->allocator->_vptr_Allocator[3])(local_950->allocator,local_950->data);
            }
          }
        }
        local_950->data = (void *)0x0;
        local_950->elemsize = 0;
        local_950->elempack = 0;
        local_950->dims = 0;
        local_950->w = 0;
        local_950->h = 0;
        local_950->d = 0;
        local_950->c = 0;
        local_950->cstep = 0;
        local_950->refcount = (int *)0x0;
        local_950->data = local_7d8->data;
        local_950->refcount = local_7d8->refcount;
        local_950->elemsize = local_7d8->elemsize;
        local_950->elempack = local_7d8->elempack;
        local_950->allocator = local_7d8->allocator;
        local_950->dims = local_7d8->dims;
        local_950->w = local_7d8->w;
        local_950->h = local_7d8->h;
        local_950->d = local_7d8->d;
        local_950->c = local_7d8->c;
        local_950->cstep = local_7d8->cstep;
      }
      return 0;
    }
    Mat::create(in_stack_fffffffffffff090,in_stack_fffffffffffff08c,(size_t)this_00,_allocator);
    local_778 = local_950;
    bVar4 = true;
    if (local_950->data != (void *)0x0) {
      local_310 = local_950;
      bVar4 = local_950->cstep * (long)local_950->c == 0;
    }
    if (bVar4) {
      return -100;
    }
    if (local_978 == 1) {
      copy_cut_border_image<signed_char>
                ((Mat *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                 in_stack_fffffffffffff090,in_stack_fffffffffffff08c,in_stack_fffffffffffff088);
    }
    if (local_978 == 2) {
      copy_cut_border_image<unsigned_short>
                ((Mat *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                 in_stack_fffffffffffff090,in_stack_fffffffffffff08c,in_stack_fffffffffffff088);
    }
    if (local_978 == 4) {
      copy_cut_border_image<float>
                ((Mat *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                 in_stack_fffffffffffff090,in_stack_fffffffffffff08c,in_stack_fffffffffffff088);
    }
  }
  if (local_96c == 2) {
    if ((local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
         super__Vector_impl_data._M_finish._4_4_ == local_95c) &&
       ((int)local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_finish == local_960)) {
      local_7f0 = local_950;
      local_7f8 = local_948;
      if (local_950 != local_948) {
        if (local_948->refcount != (int *)0x0) {
          piVar1 = local_948->refcount;
          local_7fc = 1;
          LOCK();
          local_800 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_5d0 = local_950;
        if (local_950->refcount != (int *)0x0) {
          piVar1 = local_950->refcount;
          local_5d4 = 0xffffffff;
          LOCK();
          local_5d8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_5d8 == 1) {
            if (local_950->allocator == (Allocator *)0x0) {
              local_358 = local_950->data;
              if (local_358 != (void *)0x0) {
                free(local_358);
              }
            }
            else {
              (*local_950->allocator->_vptr_Allocator[3])(local_950->allocator,local_950->data);
            }
          }
        }
        local_950->data = (void *)0x0;
        local_950->elemsize = 0;
        local_950->elempack = 0;
        local_950->dims = 0;
        local_950->w = 0;
        local_950->h = 0;
        local_950->d = 0;
        local_950->c = 0;
        local_950->cstep = 0;
        local_950->refcount = (int *)0x0;
        local_950->data = local_7f8->data;
        local_950->refcount = local_7f8->refcount;
        local_950->elemsize = local_7f8->elemsize;
        local_950->elempack = local_7f8->elempack;
        local_950->allocator = local_7f8->allocator;
        local_950->dims = local_7f8->dims;
        local_950->w = local_7f8->w;
        local_950->h = local_7f8->h;
        local_950->d = local_7f8->d;
        local_950->c = local_7f8->c;
        local_950->cstep = local_7f8->cstep;
      }
      return 0;
    }
    Mat::create(in_stack_fffffffffffff090,in_stack_fffffffffffff08c,in_stack_fffffffffffff088,
                (size_t)this_00,_allocator);
    local_780 = local_950;
    bVar4 = true;
    if (local_950->data != (void *)0x0) {
      local_308 = local_950;
      bVar4 = local_950->cstep * (long)local_950->c == 0;
    }
    if (bVar4) {
      return -100;
    }
    if (local_978 == 1) {
      copy_cut_border_image<signed_char>
                ((Mat *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                 in_stack_fffffffffffff090,in_stack_fffffffffffff08c,in_stack_fffffffffffff088);
    }
    if (local_978 == 2) {
      copy_cut_border_image<unsigned_short>
                ((Mat *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                 in_stack_fffffffffffff090,in_stack_fffffffffffff08c,in_stack_fffffffffffff088);
    }
    if (local_978 == 4) {
      copy_cut_border_image<float>
                ((Mat *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                 in_stack_fffffffffffff090,in_stack_fffffffffffff08c,in_stack_fffffffffffff088);
    }
  }
  if (local_96c == 3) {
    if (((local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ == local_95c) &&
        ((int)local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish == local_960)) &&
       ((int)local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start == local_968)) {
      local_810 = local_950;
      local_818 = local_948;
      if (local_950 != local_948) {
        if (local_948->refcount != (int *)0x0) {
          piVar1 = local_948->refcount;
          local_81c = 1;
          LOCK();
          local_820 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_5c0 = local_950;
        pvVar6 = local_950;
        if (local_950->refcount != (int *)0x0) {
          piVar1 = local_950->refcount;
          local_5c4 = 0xffffffff;
          LOCK();
          local_5c8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_5c8 == 1) {
            if (local_950->allocator == (Allocator *)0x0) {
              local_360 = local_950->data;
              if (local_360 != (void *)0x0) {
                free(local_360);
              }
            }
            else {
              (*local_950->allocator->_vptr_Allocator[3])(local_950->allocator,local_950->data);
            }
          }
        }
        local_950->data = (void *)0x0;
        local_950->elemsize = 0;
        local_950->elempack = 0;
        local_950->dims = 0;
        local_950->w = 0;
        local_950->h = 0;
        local_950->d = 0;
        local_950->c = 0;
        local_950->cstep = 0;
        local_950->refcount = (int *)0x0;
        pvVar6->data = local_818->data;
        pvVar6->refcount = local_818->refcount;
        pvVar6->elemsize = local_818->elemsize;
        pvVar6->elempack = local_818->elempack;
        pvVar6->allocator = local_818->allocator;
        pvVar6->dims = local_818->dims;
        pvVar6->w = local_818->w;
        pvVar6->h = local_818->h;
        pvVar6->d = local_818->d;
        pvVar6->c = local_818->c;
        pvVar6->cstep = local_818->cstep;
      }
      return 0;
    }
    local_718 = &local_a58;
    local_1e4 = local_948->w;
    local_1e8 = local_948->h;
    local_1ec = local_948->d;
    local_1f8 = (void *)((long)local_948->data +
                        local_948->cstep *
                        (long)(int)local_998.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage * local_948->elemsize)
    ;
    local_200 = local_948->elemsize;
    local_204 = local_948->elempack;
    local_210 = local_948->allocator;
    local_1e0 = &local_a58;
    local_a50 = (int *)0x0;
    local_a20 = (int)local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start;
    local_1d0 = (long)local_1e4 * (long)local_1e8 * (long)(int)local_1ec * local_200;
    local_a18 = (local_1d0 + 0xfU & 0xfffffffffffffff0) / local_200;
    local_a30 = local_948->dims;
    local_1d4 = 0x10;
    local_729 = 1;
    local_a58 = local_1f8;
    local_a48 = local_200;
    local_a40 = local_204;
    local_a38 = local_210;
    local_a2c = local_1e4;
    local_a28 = local_1e8;
    local_a24 = local_1ec;
    if ((local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
         super__Vector_impl_data._M_finish._4_4_ == local_95c) &&
       ((int)local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_finish == local_960)) {
      Mat::clone(&local_aa0,(__fn *)&local_a58,*(void **)(local_958 + 8),(int)local_1e0,
                 (void *)(ulong)local_1ec);
      local_830 = local_950;
      local_838 = &local_aa0;
      if (local_950 != local_838) {
        if (local_aa0.refcount != (int *)0x0) {
          local_83c = 1;
          LOCK();
          local_840 = *local_aa0.refcount;
          *local_aa0.refcount = *local_aa0.refcount + 1;
          UNLOCK();
        }
        local_5b0 = local_950;
        pvVar6 = local_950;
        pvVar3 = local_950;
        if (local_950->refcount != (int *)0x0) {
          piVar1 = local_950->refcount;
          local_5b4 = 0xffffffff;
          LOCK();
          local_5b8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_5b8 == 1) {
            if (local_950->allocator == (Allocator *)0x0) {
              local_368 = local_950->data;
              if (local_368 != (void *)0x0) {
                free(local_368);
              }
            }
            else {
              (*local_950->allocator->_vptr_Allocator[3])(local_950->allocator,local_950->data);
            }
          }
        }
        pvVar6->data = (void *)0x0;
        pvVar6->elemsize = 0;
        pvVar6->elempack = 0;
        pvVar6->dims = 0;
        pvVar6->w = 0;
        pvVar6->h = 0;
        pvVar6->d = 0;
        pvVar6->c = 0;
        pvVar6->cstep = 0;
        pvVar6->refcount = (int *)0x0;
        pvVar3->data = local_838->data;
        pvVar3->refcount = local_838->refcount;
        pvVar3->elemsize = local_838->elemsize;
        pvVar3->elempack = local_838->elempack;
        pvVar3->allocator = local_838->allocator;
        pvVar3->dims = local_838->dims;
        pvVar3->w = local_838->w;
        pvVar3->h = local_838->h;
        pvVar3->d = local_838->d;
        pvVar3->c = local_838->c;
        pvVar3->cstep = local_838->cstep;
      }
      pMVar7 = &local_aa0;
      local_920 = pMVar7;
      local_450 = pMVar7;
      if (local_aa0.refcount != (int *)0x0) {
        local_454 = 0xffffffff;
        LOCK();
        local_458 = *local_aa0.refcount;
        *local_aa0.refcount = *local_aa0.refcount + -1;
        UNLOCK();
        if (local_458 == 1) {
          if (local_aa0.allocator == (Allocator *)0x0) {
            if (local_aa0.data != (void *)0x0) {
              free(local_aa0.data);
            }
          }
          else {
            (*(local_aa0.allocator)->_vptr_Allocator[3])(local_aa0.allocator,local_aa0.data);
          }
        }
      }
      pMVar7->data = (void *)0x0;
      pMVar7->elemsize = 0;
      pMVar7->elempack = 0;
      pMVar7->dims = 0;
      pMVar7->w = 0;
      pMVar7->h = 0;
      pMVar7->d = 0;
      pMVar7->c = 0;
      pMVar7->cstep = 0;
      pMVar7->refcount = (int *)0x0;
      local_788 = local_950;
      bVar4 = true;
      if (local_950->data != (void *)0x0) {
        local_300 = local_950;
        bVar4 = local_950->cstep * (long)local_950->c == 0;
      }
      if (bVar4) {
        local_934 = -100;
        local_aa4 = 1;
      }
      else {
        local_934 = 0;
        local_aa4 = 1;
      }
    }
    else {
      Mat::create(in_stack_fffffffffffff0a0,in_stack_fffffffffffff09c,in_stack_fffffffffffff098,
                  (int)((ulong)in_stack_fffffffffffff090 >> 0x20),
                  CONCAT44(in_stack_fffffffffffff08c,in_stack_fffffffffffff088),(Allocator *)this_00
                 );
      local_790 = local_950;
      bVar4 = true;
      if (local_950->data != (void *)0x0) {
        local_2f8 = local_950;
        bVar4 = local_950->cstep * (long)local_950->c == 0;
      }
      if (bVar4) {
        local_934 = -100;
        local_aa4 = 1;
      }
      else {
        for (local_aa8 = 0;
            local_aa8 <
            (int)local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start; local_aa8 = local_aa8 + 1) {
          local_6d8 = &local_af0;
          local_6e0 = &local_a58;
          local_d8 = (void *)((long)local_a58 + local_a18 * (long)local_aa8 * local_a48);
          local_c0 = &local_af0;
          local_ae8 = (int *)0x0;
          local_ae0 = local_a48;
          local_ad8 = local_a40;
          local_ad0 = local_a38;
          local_ac4 = local_a2c;
          local_ac0 = local_a28;
          local_abc = 1;
          local_ab8 = local_a24;
          local_b0 = (long)local_a2c * (long)local_a28 * local_a48;
          local_ab0 = (local_b0 + 0xfU & 0xfffffffffffffff0) / local_a48;
          local_ac8 = local_a30 + -1;
          if (local_a30 == 4) {
            local_ab0 = (long)local_a2c * (long)local_a28;
          }
          local_698 = &local_b38;
          local_154 = local_950->w;
          local_158 = local_950->h;
          local_15c = local_950->d;
          local_168 = (void *)((long)local_950->data +
                              local_950->cstep * (long)local_aa8 * local_950->elemsize);
          local_170 = local_950->elemsize;
          local_174 = local_950->elempack;
          local_180 = local_950->allocator;
          local_150 = &local_b38;
          local_b30 = (int *)0x0;
          local_b04 = 1;
          local_140 = (long)local_154 * (long)local_158 * local_170;
          local_af8 = (local_140 + 0xfU & 0xfffffffffffffff0) / local_170;
          local_b10 = local_950->dims + -1;
          if (local_950->dims == 4) {
            local_af8 = (long)local_950->w * (long)local_950->h;
          }
          local_b4 = 0x10;
          local_c4 = local_a2c;
          local_c8 = local_a28;
          local_cc = local_a24;
          local_e0 = local_a48;
          local_e4 = local_a40;
          local_f0 = local_a38;
          local_144 = 0x10;
          local_6a4 = local_aa8;
          local_6a5 = 1;
          local_6e4 = local_aa8;
          local_6e5 = 1;
          local_b38 = local_168;
          local_b28 = local_170;
          local_b20 = local_174;
          local_b18 = local_180;
          local_b0c = local_154;
          local_b08 = local_158;
          local_b00 = local_15c;
          local_af0 = local_d8;
          if (local_978 == 1) {
            copy_cut_border_image<signed_char>
                      ((Mat *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                       in_stack_fffffffffffff090,in_stack_fffffffffffff08c,in_stack_fffffffffffff088
                      );
          }
          if (local_978 == 2) {
            copy_cut_border_image<unsigned_short>
                      ((Mat *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                       in_stack_fffffffffffff090,in_stack_fffffffffffff08c,in_stack_fffffffffffff088
                      );
          }
          if (local_978 == 4) {
            copy_cut_border_image<float>
                      ((Mat *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                       in_stack_fffffffffffff090,in_stack_fffffffffffff08c,in_stack_fffffffffffff088
                      );
          }
          local_910 = &local_b38;
          local_470 = local_910;
          if (local_b30 != (int *)0x0) {
            local_474 = 0xffffffff;
            LOCK();
            local_478 = *local_b30;
            *local_b30 = *local_b30 + -1;
            UNLOCK();
            if (local_478 == 1) {
              if (local_b18 == (Allocator *)0x0) {
                local_408 = local_b38;
                if (local_b38 != (void *)0x0) {
                  free(local_b38);
                }
              }
              else {
                (*local_b18->_vptr_Allocator[3])(local_b18,local_b38);
              }
            }
          }
          local_b38 = (void *)0x0;
          local_b28 = 0;
          local_b20 = 0;
          local_b10 = 0;
          local_b0c = 0;
          local_b08 = 0;
          local_b04 = 0;
          local_b00 = 0;
          local_af8 = 0;
          local_b30 = (int *)0x0;
          local_900 = &local_af0;
          local_490 = local_900;
          if (local_ae8 != (int *)0x0) {
            local_494 = 0xffffffff;
            LOCK();
            local_498 = *local_ae8;
            *local_ae8 = *local_ae8 + -1;
            UNLOCK();
            if (local_498 == 1) {
              if (local_ad0 == (Allocator *)0x0) {
                local_3f8 = local_af0;
                if (local_af0 != (void *)0x0) {
                  free(local_af0);
                }
              }
              else {
                (*local_ad0->_vptr_Allocator[3])(local_ad0,local_af0);
              }
            }
          }
          local_af0 = (void *)0x0;
          local_ae0 = 0;
          local_ad8 = 0;
          local_ac8 = 0;
          local_ac4 = 0;
          local_ac0 = 0;
          local_abc = 0;
          local_ab8 = 0;
          local_ab0 = 0;
          local_ae8 = (int *)0x0;
        }
        local_aa4 = 0;
      }
    }
    local_8f0 = &local_a58;
    local_4b0 = local_8f0;
    if (local_a50 != (int *)0x0) {
      local_4b4 = 0xffffffff;
      LOCK();
      local_4b8 = *local_a50;
      *local_a50 = *local_a50 + -1;
      UNLOCK();
      if (local_4b8 == 1) {
        if (local_a38 == (Allocator *)0x0) {
          local_3e8 = local_a58;
          if (local_a58 != (void *)0x0) {
            free(local_a58);
          }
        }
        else {
          (*local_a38->_vptr_Allocator[3])(local_a38,local_a58);
        }
      }
    }
    local_a58 = (void *)0x0;
    local_a48 = 0;
    local_a40 = 0;
    local_a30 = 0;
    local_a2c = 0;
    local_a28 = 0;
    local_a24 = 0;
    local_a20 = 0;
    local_a18 = 0;
    local_a50 = (int *)0x0;
    if (local_aa4 != 0) {
      return local_934;
    }
  }
  if (local_96c == 4) {
    if (((local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ == local_95c) &&
        ((int)local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish == local_960)) &&
       ((local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
         super__Vector_impl_data._M_start._4_4_ == local_964 &&
        ((int)local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start == local_968)))) {
      local_850 = local_950;
      local_858 = local_948;
      if (local_950 != local_948) {
        if (local_948->refcount != (int *)0x0) {
          piVar1 = local_948->refcount;
          local_85c = 1;
          LOCK();
          local_860 = *piVar1;
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        local_5a0 = local_950;
        pvVar6 = local_950;
        if (local_950->refcount != (int *)0x0) {
          piVar1 = local_950->refcount;
          local_5a4 = 0xffffffff;
          LOCK();
          local_5a8 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_5a8 == 1) {
            if (local_950->allocator == (Allocator *)0x0) {
              local_370 = local_950->data;
              if (local_370 != (void *)0x0) {
                free(local_370);
              }
            }
            else {
              (*local_950->allocator->_vptr_Allocator[3])(local_950->allocator,local_950->data);
            }
          }
        }
        local_950->data = (void *)0x0;
        local_950->elemsize = 0;
        local_950->elempack = 0;
        local_950->dims = 0;
        local_950->w = 0;
        local_950->h = 0;
        local_950->d = 0;
        local_950->c = 0;
        local_950->cstep = 0;
        local_950->refcount = (int *)0x0;
        pvVar6->data = local_858->data;
        pvVar6->refcount = local_858->refcount;
        pvVar6->elemsize = local_858->elemsize;
        pvVar6->elempack = local_858->elempack;
        pvVar6->allocator = local_858->allocator;
        pvVar6->dims = local_858->dims;
        pvVar6->w = local_858->w;
        pvVar6->h = local_858->h;
        pvVar6->d = local_858->d;
        pvVar6->c = local_858->c;
        pvVar6->cstep = local_858->cstep;
      }
      return 0;
    }
    local_740 = &local_b80;
    local_19c = local_948->w;
    local_1a0 = local_948->h;
    local_1a4 = local_948->d;
    local_1b0 = (void *)((long)local_948->data +
                        local_948->cstep *
                        (long)(int)local_998.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage * local_948->elemsize)
    ;
    local_1b8 = local_948->elemsize;
    local_1bc = local_948->elempack;
    local_1c8 = local_948->allocator;
    local_198 = &local_b80;
    local_b78 = (int *)0x0;
    local_b48 = (int)local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start;
    local_188 = (long)local_19c * (long)local_1a0 * (long)(int)local_1a4 * local_1b8;
    local_b40 = (local_188 + 0xfU & 0xfffffffffffffff0) / local_1b8;
    local_b58 = local_948->dims;
    local_18c = 0x10;
    local_751 = 1;
    local_b80 = local_1b0;
    local_b70 = local_1b8;
    local_b68 = local_1bc;
    local_b60 = local_1c8;
    local_b54 = local_19c;
    local_b50 = local_1a0;
    local_b4c = local_1a4;
    if (((local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ == local_95c) &&
        ((int)local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish == local_960)) &&
       (local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ == local_964)) {
      Mat::clone(&local_bc8,(__fn *)&local_b80,*(void **)(local_958 + 8),(int)local_198,
                 (void *)(ulong)local_1a4);
      pvVar6 = local_950;
      local_870 = local_950;
      local_878 = &local_bc8;
      if (local_950 != local_878) {
        if (local_bc8.refcount != (int *)0x0) {
          local_87c = 1;
          LOCK();
          local_880 = *local_bc8.refcount;
          *local_bc8.refcount = *local_bc8.refcount + 1;
          UNLOCK();
        }
        local_590 = local_950;
        pvVar3 = local_950;
        if (local_950->refcount != (int *)0x0) {
          piVar1 = local_950->refcount;
          local_594 = 0xffffffff;
          LOCK();
          local_598 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_598 == 1) {
            if (local_950->allocator == (Allocator *)0x0) {
              local_378 = local_950->data;
              if (local_378 != (void *)0x0) {
                free(local_378);
              }
            }
            else {
              (*local_950->allocator->_vptr_Allocator[3])(local_950->allocator,local_950->data);
            }
          }
        }
        pvVar6->data = (void *)0x0;
        pvVar6->elemsize = 0;
        pvVar6->elempack = 0;
        pvVar6->dims = 0;
        pvVar6->w = 0;
        pvVar6->h = 0;
        pvVar6->d = 0;
        pvVar6->c = 0;
        pvVar6->cstep = 0;
        pvVar6->refcount = (int *)0x0;
        pvVar3->data = local_878->data;
        pvVar3->refcount = local_878->refcount;
        pvVar3->elemsize = local_878->elemsize;
        pvVar3->elempack = local_878->elempack;
        pvVar3->allocator = local_878->allocator;
        pvVar3->dims = local_878->dims;
        pvVar3->w = local_878->w;
        pvVar3->h = local_878->h;
        pvVar3->d = local_878->d;
        pvVar3->c = local_878->c;
        pvVar3->cstep = local_878->cstep;
      }
      local_8e0 = &local_bc8;
      local_4d0 = local_8e0;
      if (local_bc8.refcount != (int *)0x0) {
        local_4d4 = 0xffffffff;
        LOCK();
        local_4d8 = *local_bc8.refcount;
        *local_bc8.refcount = *local_bc8.refcount + -1;
        UNLOCK();
        if (local_4d8 == 1) {
          if (local_bc8.allocator == (Allocator *)0x0) {
            if (local_bc8.data != (void *)0x0) {
              free(local_bc8.data);
            }
          }
          else {
            (*(local_bc8.allocator)->_vptr_Allocator[3])(local_bc8.allocator,local_bc8.data);
          }
        }
      }
      local_bc8.data = (void *)0x0;
      local_bc8.elemsize = 0;
      local_bc8.elempack = 0;
      local_bc8.dims = 0;
      local_bc8.w = 0;
      local_bc8.h = 0;
      local_bc8.d = 0;
      local_bc8.c = 0;
      local_bc8.cstep = 0;
      local_bc8.refcount = (int *)0x0;
      local_798 = local_950;
      bVar4 = true;
      if (local_950->data != (void *)0x0) {
        local_2f0 = local_950;
        bVar4 = local_950->cstep * (long)local_950->c == 0;
      }
      if (bVar4) {
        local_934 = -100;
        local_aa4 = 1;
      }
      else {
        local_934 = 0;
        local_aa4 = 1;
      }
    }
    else {
      Mat::create(in_stack_fffffffffffff090,in_stack_fffffffffffff08c,in_stack_fffffffffffff088,
                  (int)((ulong)this_00 >> 0x20),(int)this_00,(size_t)_allocator,
                  in_stack_fffffffffffff0f0);
      local_7a0 = local_950;
      bVar4 = true;
      if (local_950->data != (void *)0x0) {
        local_2e8 = local_950;
        bVar4 = local_950->cstep * (long)local_950->c == 0;
      }
      if (bVar4) {
        local_934 = -100;
        local_aa4 = 1;
      }
      else {
        for (local_bcc = 0;
            local_bcc <
            (int)local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start; local_bcc = local_bcc + 1) {
          for (local_bd0 = 0;
              local_bd0 <
              local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_; local_bd0 = local_bd0 + 1) {
            local_6f8 = &local_c60;
            local_700 = &local_b80;
            local_90 = (void *)((long)local_b80 + local_b40 * (long)local_bcc * local_b70);
            local_78 = &local_c60;
            local_68 = (long)local_b54 * (long)local_b50 * local_b70;
            local_684 = local_bd0 +
                        local_998.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_;
            local_678 = &local_c18;
            local_680 = &local_c60;
            local_18 = (void *)((long)local_90 +
                               (long)local_b54 * (long)local_b50 * (long)local_684 * local_b70);
            local_8 = &local_c18;
            local_bd8 = (long)local_b54 * (long)local_b50;
            local_8d0 = &local_c60;
            local_6b8 = &local_cf0;
            local_10c = local_950->w;
            local_110 = local_950->h;
            local_114 = local_950->d;
            local_120 = (void *)((long)local_950->data +
                                local_950->cstep * (long)local_bcc * local_950->elemsize);
            local_128 = local_950->elemsize;
            local_12c = local_950->elempack;
            local_138 = local_950->allocator;
            local_108 = &local_cf0;
            local_f8 = (long)local_10c * (long)local_110 * local_128;
            local_660 = &local_ca8;
            local_668 = &local_cf0;
            local_48 = (void *)((long)local_120 +
                               (long)local_10c * (long)local_110 * (long)local_bd0 * local_128);
            local_38 = &local_ca8;
            local_c68 = (long)local_10c * (long)local_110;
            local_8c0 = &local_cf0;
            local_be0 = 1;
            local_be4 = 1;
            local_be8 = local_b50;
            local_bec = local_b54;
            local_bf0 = 2;
            local_bf8 = local_b60;
            local_c00 = local_b68;
            local_c08 = local_b70;
            local_c10 = (int *)0x0;
            local_c28 = 0;
            local_c2c = 0;
            local_c30 = 0;
            local_c34 = 0;
            local_c40 = local_b60;
            local_c48 = 0;
            local_c50 = 0;
            local_c58 = 0;
            local_c60 = 0;
            local_c70 = 1;
            local_c74 = 1;
            local_c80 = 2;
            local_ca0 = (int *)0x0;
            local_c = local_b54;
            local_10 = local_b50;
            local_20 = local_b70;
            local_24 = local_b68;
            local_30 = local_b60;
            local_6c = 0x10;
            local_7c = local_b54;
            local_80 = local_b50;
            local_84 = local_b4c;
            local_98 = local_b70;
            local_9c = local_b68;
            local_a8 = local_b60;
            local_fc = 0x10;
            local_66c = local_bd0;
            local_6c4 = local_bcc;
            local_6c5 = 1;
            local_704 = local_bcc;
            local_705 = 1;
            local_c20 = 0;
            local_c38 = 0;
            local_cf0 = 0;
            local_ce0 = 0;
            local_cd8 = 0;
            local_cc8 = 0;
            local_cc4 = 0;
            local_cc0 = 0;
            local_cbc = 0;
            local_cb8 = 0;
            local_cb0 = 0;
            local_ce8 = 0;
            local_510 = local_8c0;
            local_4f0 = local_8d0;
            local_60 = local_138;
            local_54 = local_12c;
            local_50 = local_128;
            local_40 = local_110;
            local_3c = local_10c;
            local_cd0 = local_138;
            local_ca8 = local_48;
            local_c98 = local_128;
            local_c90 = local_12c;
            local_c88 = local_138;
            local_c7c = local_10c;
            local_c78 = local_110;
            local_c18 = local_18;
            if (local_978 == 1) {
              copy_cut_border_image<signed_char>
                        ((Mat *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                         in_stack_fffffffffffff090,in_stack_fffffffffffff08c,
                         in_stack_fffffffffffff088);
            }
            if (local_978 == 2) {
              copy_cut_border_image<unsigned_short>
                        ((Mat *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                         in_stack_fffffffffffff090,in_stack_fffffffffffff08c,
                         in_stack_fffffffffffff088);
            }
            if (local_978 == 4) {
              copy_cut_border_image<float>
                        ((Mat *)CONCAT44(in_stack_fffffffffffff09c,in_stack_fffffffffffff098),
                         in_stack_fffffffffffff090,in_stack_fffffffffffff08c,
                         in_stack_fffffffffffff088);
            }
            local_8b0 = &local_ca8;
            local_530 = local_8b0;
            if (local_ca0 != (int *)0x0) {
              local_534 = 0xffffffff;
              LOCK();
              local_538 = *local_ca0;
              *local_ca0 = *local_ca0 + -1;
              UNLOCK();
              if (local_538 == 1) {
                if (local_c88 == (Allocator *)0x0) {
                  local_3a8 = local_ca8;
                  if (local_ca8 != (void *)0x0) {
                    free(local_ca8);
                  }
                }
                else {
                  (*local_c88->_vptr_Allocator[3])(local_c88,local_ca8);
                }
              }
            }
            local_ca8 = (void *)0x0;
            local_c98 = 0;
            local_c90 = 0;
            local_c80 = 0;
            local_c7c = 0;
            local_c78 = 0;
            local_c74 = 0;
            local_c70 = 0;
            local_c68 = 0;
            local_ca0 = (int *)0x0;
            ppvVar5 = &local_c18;
            local_8a0 = ppvVar5;
            local_550 = ppvVar5;
            if (local_c10 != (int *)0x0) {
              local_554 = 0xffffffff;
              LOCK();
              local_558 = *local_c10;
              *local_c10 = *local_c10 + -1;
              UNLOCK();
              if (local_558 == 1) {
                if (local_bf8 == (Allocator *)0x0) {
                  local_398 = local_c18;
                  if (local_c18 != (void *)0x0) {
                    free(local_c18);
                  }
                }
                else {
                  (*local_bf8->_vptr_Allocator[3])(local_bf8,local_c18);
                }
              }
            }
            *ppvVar5 = (void *)0x0;
            ppvVar5[2] = (void *)0x0;
            *(undefined4 *)(ppvVar5 + 3) = 0;
            *(undefined4 *)(ppvVar5 + 5) = 0;
            *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
            *(undefined4 *)(ppvVar5 + 6) = 0;
            *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
            *(undefined4 *)(ppvVar5 + 7) = 0;
            ppvVar5[8] = (void *)0x0;
            ppvVar5[1] = (void *)0x0;
          }
        }
        local_aa4 = 0;
      }
    }
    ppvVar5 = &local_b80;
    if (local_b78 != (int *)0x0) {
      local_574 = 0xffffffff;
      LOCK();
      local_578 = *local_b78;
      *local_b78 = *local_b78 + -1;
      UNLOCK();
      if (local_578 == 1) {
        local_890 = ppvVar5;
        local_570 = ppvVar5;
        if (local_b60 == (Allocator *)0x0) {
          local_388 = local_b80;
          if (local_b80 != (void *)0x0) {
            free(local_b80);
          }
        }
        else {
          (*local_b60->_vptr_Allocator[3])(local_b60,local_b80);
        }
      }
    }
    *ppvVar5 = (void *)0x0;
    ppvVar5[2] = (void *)0x0;
    *(undefined4 *)(ppvVar5 + 3) = 0;
    *(undefined4 *)(ppvVar5 + 5) = 0;
    *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
    *(undefined4 *)(ppvVar5 + 6) = 0;
    *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
    *(undefined4 *)(ppvVar5 + 7) = 0;
    ppvVar5[8] = (void *)0x0;
    ppvVar5[1] = (void *)0x0;
    if (local_aa4 != 0) {
      return local_934;
    }
  }
  return 0;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset, _hoffset, _doffset, _coffset;
    int _outw = -1, _outh = -1, _outd = -1, _outc;

    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blobs(1);
        bottom_blobs[0] = bottom_blob;
        eval_crop_expr(bottom_blobs, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }
    }

    return 0;
}